

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O1

void __thiscall
vkt::texture::util::TextureBinding::TextureBinding
          (TextureBinding *this,Context *context,TestTextureSp *textureData,Type type)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  
  this->m_context = context;
  this->m_type = type;
  (this->m_textureData).m_ptr = textureData->m_ptr;
  pSVar2 = textureData->m_state;
  (this->m_textureData).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_textureData).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  (this->m_textureImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
       = (VkDevice)0x0;
  (this->m_textureImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_textureImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
       = 0;
  (this->m_textureImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_textureImageMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)0x0;
  updateTextureData(this,&this->m_textureData,this->m_type);
  return;
}

Assistant:

TextureBinding::TextureBinding (Context& context, const TestTextureSp& textureData, const TextureBinding::Type type)
	: m_context			(context)
	, m_type			(type)
	, m_textureData		(textureData)
{
	updateTextureData(m_textureData, m_type);
}